

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O2

void vsencoding::__vseblocks_unpack6(uint32_t *out,uint32_t *in,uint32_t bs)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint uVar9;
  uint uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar17 [32];
  
  auVar7 = vpmovsxbd_avx2(ZEXT816(0xa10161c02080e14));
  auVar16._8_4_ = 0x3f;
  auVar16._0_8_ = 0x3f0000003f;
  auVar16._12_4_ = 0x3f;
  auVar17._16_4_ = 0x3f;
  auVar17._0_16_ = auVar16;
  auVar17._20_4_ = 0x3f;
  auVar17._24_4_ = 0x3f;
  auVar17._28_4_ = 0x3f;
  auVar3 = vpmovsxbd_avx(ZEXT416(0x60c1218));
  auVar4 = vpmovsxbd_avx(ZEXT416(0x5010401));
  auVar5 = vpmovsxbd_avx(ZEXT416(0x204));
  auVar6 = vpmovsxbd_avx(ZEXT416(0x3c30));
  auVar8 = vpmovsxbd_avx2(ZEXT816(0x1e040a10161c0208));
  uVar10 = bs + 0x1f >> 5;
  while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
    uVar1 = *(ulong *)in;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar1;
    auVar12 = vpshufd_avx(auVar12,0x50);
    *out = (uint)(uVar1 >> 0x1a) & 0x3f;
    auVar21 = vpermq_avx2(ZEXT1632(auVar12),0x50);
    uVar9 = (uint)(uVar1 >> 0x20);
    auVar20 = vpsrlvd_avx2(auVar21,auVar7);
    auVar15 = vpbroadcastd_avx512vl();
    auVar21 = vpand_avx2(auVar20,auVar17);
    auVar20 = vpor_avx2(auVar15,auVar20);
    auVar21 = vpblendd_avx2(auVar21,auVar20,0x10);
    *(undefined1 (*) [32])(out + 1) = auVar21;
    out[9] = uVar9 >> 4 & 0x3f;
    uVar1 = *(ulong *)((long)in + 8);
    auVar12 = vpbroadcastd_avx512vl();
    auVar13 = vpbroadcastd_avx512vl();
    auVar12 = vpsrlvd_avx2(auVar12,auVar3);
    uVar2 = *(ulong *)((long)in + 0x10);
    in = (uint32_t *)((long)in + 0x18);
    auVar13 = vpsrlvd_avx2(auVar13,auVar7._0_16_);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar1;
    auVar20._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar12;
    auVar20._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
    auVar22._0_8_ = auVar13._0_8_;
    auVar22._8_8_ = auVar22._0_8_;
    auVar22._16_8_ = auVar22._0_8_;
    auVar22._24_8_ = auVar22._0_8_;
    out[10] = (uVar9 & 0xf) << 2 | (uint)uVar1 >> 0x1e;
    auVar21 = vpblendd_avx2(auVar20,auVar22,0xc0);
    auVar20 = vpsrld_avx2(auVar20,0x1a);
    auVar21 = vpand_avx2(auVar21,auVar17);
    auVar21 = vpblendd_avx2(auVar21,auVar20,0x20);
    *(undefined1 (*) [32])(out + 0xb) = auVar21;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar2;
    auVar12 = vshufps_avx(auVar14,auVar18,5);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar1;
    auVar14 = vpermt2d_avx512vl(auVar13,auVar4,auVar18);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar2;
    auVar13 = vshufps_avx(auVar19,auVar19,0x40);
    auVar21._16_16_ = auVar13;
    auVar21._0_16_ = auVar12;
    auVar20 = vpsrlvd_avx2(auVar21,auVar8);
    auVar12 = vpsllvd_avx2(auVar14,auVar5);
    auVar21 = vpand_avx2(auVar20,auVar17);
    auVar12 = vpand_avx(auVar12,auVar6);
    auVar15._0_8_ = auVar12._0_8_;
    auVar15._8_8_ = auVar15._0_8_;
    auVar15._16_8_ = auVar15._0_8_;
    auVar15._24_8_ = auVar15._0_8_;
    auVar20 = vpor_avx2(auVar20,auVar15);
    auVar21 = vpblendd_avx2(auVar21,auVar20,0x84);
    *(undefined1 (*) [32])(out + 0x13) = auVar21;
    auVar12 = vpbroadcastd_avx512vl();
    auVar12 = vpsrlvd_avx2(auVar12,auVar3);
    auVar12 = vpand_avx(auVar12,auVar16);
    *(undefined1 (*) [16])(out + 0x1b) = auVar12;
    out[0x1f] = (uint)(uVar2 >> 0x20) & 0x3f;
    out = out + 0x20;
  }
  return;
}

Assistant:

void __vseblocks_unpack6(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 6, --bs) {
    out[0] = in[0] >> 26;
    out[1] = (in[0] >> 20) & 0x3f;
    out[2] = (in[0] >> 14) & 0x3f;
    out[3] = (in[0] >> 8) & 0x3f;
    out[4] = (in[0] >> 2) & 0x3f;
    out[5] = (in[0] << 4) & 0x3f;
    out[5] |= in[1] >> 28;
    out[6] = (in[1] >> 22) & 0x3f;
    out[7] = (in[1] >> 16) & 0x3f;
    out[8] = (in[1] >> 10) & 0x3f;
    out[9] = (in[1] >> 4) & 0x3f;
    out[10] = (in[1] << 2) & 0x3f;
    out[10] |= in[2] >> 30;
    out[11] = (in[2] >> 24) & 0x3f;
    out[12] = (in[2] >> 18) & 0x3f;
    out[13] = (in[2] >> 12) & 0x3f;
    out[14] = (in[2] >> 6) & 0x3f;
    out[15] = in[2] & 0x3f;
    out[16] = in[3] >> 26;
    out[17] = (in[3] >> 20) & 0x3f;
    out[18] = (in[3] >> 14) & 0x3f;
    out[19] = (in[3] >> 8) & 0x3f;
    out[20] = (in[3] >> 2) & 0x3f;
    out[21] = (in[3] << 4) & 0x3f;
    out[21] |= in[4] >> 28;
    out[22] = (in[4] >> 22) & 0x3f;
    out[23] = (in[4] >> 16) & 0x3f;
    out[24] = (in[4] >> 10) & 0x3f;
    out[25] = (in[4] >> 4) & 0x3f;
    out[26] = (in[4] << 2) & 0x3f;
    out[26] |= in[5] >> 30;
    out[27] = (in[5] >> 24) & 0x3f;
    out[28] = (in[5] >> 18) & 0x3f;
    out[29] = (in[5] >> 12) & 0x3f;
    out[30] = (in[5] >> 6) & 0x3f;
    out[31] = in[5] & 0x3f;
  }
}